

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testToFloat.cpp
# Opt level: O2

uint halfToFloat(unsigned_short y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_0000003a;
  ulong uVar4;
  
  uVar4 = CONCAT62(in_register_0000003a,y);
  uVar2 = (uint)(uVar4 >> 0xf) & 0x1ffff;
  uVar1 = (uint)(uVar4 >> 10) & 0x1f;
  uVar3 = (uint)uVar4 & 0x3ff;
  if (uVar1 == 0x1f) {
    uVar2 = uVar2 << 0x1f;
    if ((y & 0x3ff) != 0) {
      uVar2 = uVar2 | (uint)uVar4 << 0xd;
    }
    return uVar2 | 0x7f800000;
  }
  if ((y & 0x7c00) == 0) {
    if ((y & 0x3ff) == 0) {
      return uVar2 << 0x1f;
    }
    uVar1 = 1;
    for (; (uVar3 >> 10 & 1) == 0; uVar3 = uVar3 * 2) {
      uVar1 = uVar1 - 1;
    }
    uVar3 = uVar3 & 0xfffffbff;
  }
  return uVar1 * 0x800000 + 0x38000000 | uVar2 << 0x1f | uVar3 << 0xd;
}

Assistant:

unsigned int
halfToFloat (unsigned short y)
{

    int s = (y >> 15) & 0x00000001;
    int e = (y >> 10) & 0x0000001f;
    int m =  y        & 0x000003ff;

    if (e == 0)
    {
	if (m == 0)
	{
	    //
	    // Plus or minus zero
	    //

	    return s << 31;
	}
	else
	{
	    //
	    // Denormalized number -- renormalize it
	    //

	    while (!(m & 0x00000400))
	    {
		m <<= 1;
		e -=  1;
	    }

	    e += 1;
	    m &= ~0x00000400;
	}
    }
    else if (e == 31)
    {
	if (m == 0)
	{
	    //
	    // Positive or negative infinity
	    //

	    return (s << 31) | 0x7f800000;
	}
	else
	{
	    //
	    // Nan -- preserve sign and significand bits
	    //

	    return (s << 31) | 0x7f800000 | (m << 13);
	}
    }

    //
    // Normalized number
    //

    e = e + (127 - 15);
    m = m << 13;

    //
    // Assemble s, e and m.
    //

    return (s << 31) | (e << 23) | m;
}